

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

CommandBufferTypes __thiscall
de::Random::
choose<vkt::(anonymous_namespace)::TestConfig::CommandBufferTypes,vkt::(anonymous_namespace)::TestConfig::CommandBufferTypes_const*>
          (Random *this,CommandBufferTypes *first,CommandBufferTypes *last)

{
  CommandBufferTypes local_24;
  CommandBufferTypes *pCStack_20;
  CommandBufferTypes val;
  CommandBufferTypes *last_local;
  CommandBufferTypes *first_local;
  Random *this_local;
  
  local_24 = 0;
  pCStack_20 = last;
  last_local = first;
  first_local = (CommandBufferTypes *)this;
  choose<vkt::(anonymous_namespace)::TestConfig::CommandBufferTypes_const*,vkt::(anonymous_namespace)::TestConfig::CommandBufferTypes*>
            (this,first,last,&local_24,1);
  return local_24;
}

Assistant:

T Random::choose (InputIter first, InputIter last)
{
	T val = T();
	DE_ASSERT(first != last);
	choose(first, last, &val, 1);
	return val;
}